

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O0

void __thiscall gui::ChatBox::updateScroll(ChatBox *this,int delta)

{
  int *piVar1;
  size_type sVar2;
  int in_ESI;
  long in_RDI;
  size_t newScroll;
  undefined1 in_stack_000002bf;
  ChatBox *in_stack_000002c0;
  int local_40;
  int local_24 [3];
  long local_18;
  
  local_24[2] = (int)*(undefined8 *)(in_RDI + 0x338) + in_ESI;
  local_24[1] = 0;
  piVar1 = std::max<int>(local_24 + 2,local_24 + 1);
  sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size
                    ((deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *)0x17d5b3);
  if (sVar2 == 0) {
    local_40 = 0;
  }
  else {
    sVar2 = std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::size
                      ((deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *)0x17d5ca);
    local_40 = (int)sVar2 + -1;
  }
  local_24[0] = local_40;
  piVar1 = std::min<int>(piVar1,local_24);
  local_18 = (long)*piVar1;
  if (*(long *)(in_RDI + 0x338) != local_18) {
    *(long *)(in_RDI + 0x338) = local_18;
    updateVisibleLines(in_stack_000002c0,(bool)in_stack_000002bf);
  }
  return;
}

Assistant:

void ChatBox::updateScroll(int delta) {
    size_t newScroll = std::min(std::max(static_cast<int>(verticalScroll_) + delta, 0), static_cast<int>(lines_.size() > 0 ? lines_.size() - 1 : 0));
    if (verticalScroll_ != newScroll) {
        verticalScroll_ = newScroll;
        updateVisibleLines();
    }
}